

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlbits.c
# Opt level: O3

void controlbits(uchar *out,uint32_t *pi)

{
  uchar c [5888];
  uchar auStack_1718 [5888];
  
  memset(auStack_1718,0,0x1700);
  controlbitsfrompermutation(0xc,0x1000,1,0,auStack_1718,pi);
  memcpy(out,auStack_1718,0x1700);
  return;
}

Assistant:

void controlbits(unsigned char * out, uint32_t * pi)
{
	unsigned int i;
	unsigned char c[ (2*GFBITS - 1) * (1 << GFBITS) / 16 ];

	for (i = 0; i < sizeof(c); i++)
		c[i] = 0;

	controlbitsfrompermutation(GFBITS, (1 << GFBITS), 1, 0, c, pi);

	for (i = 0; i < sizeof(c); i++)
		out[i] = c[i];
}